

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_node<std::istream>
               (ImputeNode *node,basic_istream<char,_std::char_traits<char>_> *in)

{
  pointer pvVar1;
  vector<double,_std::allocator<double>_> *v;
  pointer vec;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t data_sizets [5];
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_type local_40;
  size_t local_38;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>(&local_58,5,in);
    node->parent = local_58;
    read_bytes<double>(&node->num_sum,local_50,in);
    read_bytes<double>(&node->num_weight,local_48,in);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&node->cat_sum,local_40);
    if (local_40 != 0) {
      vec = (node->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (node->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (vec != pvVar1) {
        do {
          read_bytes<unsigned_long>(&local_60,1,in);
          read_bytes<double>(vec,local_60,in);
          vec = vec + 1;
        } while (vec != pvVar1);
      }
    }
    if ((node->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (node->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
      ::_S_do_it(&node->cat_sum);
    }
    read_bytes<double>(&node->cat_weight,local_38,in);
  }
  return;
}

Assistant:

void deserialize_node(ImputeNode &node, itype &in)
{
    if (interrupt_switch) return;

    size_t data_sizets[5];
    read_bytes<size_t>((void*)data_sizets, (size_t)5, in);
    node.parent = data_sizets[0];

    read_bytes<double>(node.num_sum, data_sizets[1], in);

    read_bytes<double>(node.num_weight, data_sizets[2], in);

    node.cat_sum.resize(data_sizets[3]);
    if (data_sizets[3]) {
        size_t veclen;
        for (auto &v : node.cat_sum) {
            read_bytes<size_t>((void*)&veclen, (size_t)1, in);
            read_bytes<double>(v, veclen, in);
        }
    }
    node.cat_sum.shrink_to_fit();

    read_bytes<double>(node.cat_weight, data_sizets[4], in);
}